

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcssub.c
# Opt level: O0

int ffgtcs(fitsfile *fptr,int xcol,int ycol,double *xrval,double *yrval,double *xrpix,double *yrpix,
          double *xinc,double *yinc,double *rot,char *type,int *status)

{
  fitsfile *tptr;
  long naxes [2];
  int colnum [2];
  double *in_stack_00000078;
  double *in_stack_00000080;
  double *in_stack_00000088;
  char *in_stack_000000c0;
  int *in_stack_000000c8;
  int *in_stack_000006c8;
  int *in_stack_000006d0;
  int in_stack_000006d8;
  int in_stack_000006dc;
  fitsfile *in_stack_000006e0;
  fitsfile *in_stack_000006e8;
  int *in_stack_00000828;
  char *in_stack_00000830;
  fitsfile **in_stack_00000838;
  int *in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffff88;
  int *in_stack_ffffffffffffff90;
  int naxis;
  fitsfile *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  fitsfile *fptr_00;
  undefined4 local_c;
  
  if (*(int *)naxes[0] < 1) {
    fptr_00 = (fitsfile *)0xa;
    ffinit(in_stack_00000838,in_stack_00000830,in_stack_00000828);
    ffcrim(fptr_00,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
           (long *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    naxis = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
    fits_copy_pixlist2image
              (in_stack_000006e8,in_stack_000006e0,in_stack_000006dc,in_stack_000006d8,
               in_stack_000006d0,in_stack_000006c8);
    fits_write_keys_histo
              ((fitsfile *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98,naxis,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    if (*(int *)naxes[0] < 1) {
      ffgics((fitsfile *)xinc,yrpix,in_stack_00000088,in_stack_00000080,in_stack_00000078,
             (double *)fptr,(double *)type,(double *)status,in_stack_000000c0,in_stack_000000c8);
      if (*(int *)naxes[0] < 1) {
        ffdelt(fptr_00,(int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        local_c = *(int *)naxes[0];
      }
      else {
        ffpmsg((char *)0x24e22c);
        *(undefined4 *)naxes[0] = 0x1f9;
        local_c = 0x1f9;
      }
    }
    else {
      local_c = *(int *)naxes[0];
    }
  }
  else {
    local_c = *(int *)naxes[0];
  }
  return local_c;
}

Assistant:

int ffgtcs(fitsfile *fptr,    /* I - FITS file pointer           */
           int xcol,          /* I - column containing the RA coordinate  */
           int ycol,          /* I - column containing the DEC coordinate */
           double *xrval,     /* O - X reference value           */
           double *yrval,     /* O - Y reference value           */
           double *xrpix,     /* O - X reference pixel           */
           double *yrpix,     /* O - Y reference pixel           */
           double *xinc,      /* O - X increment per pixel       */
           double *yinc,      /* O - Y increment per pixel       */
           double *rot,       /* O - rotation angle (degrees)    */
           char *type,        /* O - type of projection ('-sin') */
           int *status)       /* IO - error status               */
/*
       read the values of the celestial coordinate system keywords
       from a FITS table where the X and Y or RA and DEC coordinates
       are stored in separate column.  Do this by converting the
       table to a temporary FITS image, then reading the keywords
       from the image file.
       These values may be used as input to the subroutines that
       calculate celestial coordinates. (ffxypx, ffwldp)
*/
{
    int colnum[2];
    long naxes[2];
    fitsfile *tptr;

    if (*status > 0)
       return(*status);

    colnum[0] = xcol;
    colnum[1] = ycol;
    naxes[0] = 10;
    naxes[1] = 10;

    /* create temporary  FITS file, in memory */
    ffinit(&tptr, "mem://", status);
    
    /* create a temporary image; the datatype and size are not important */
    ffcrim(tptr, 32, 2, naxes, status);
    
    /* now copy the relevant keywords from the table to the image */
    fits_copy_pixlist2image(fptr, tptr, 9, 2, colnum, status);

    /* write default WCS keywords, if they are not present */
    fits_write_keys_histo(fptr, tptr, 2, colnum, status);

    if (*status > 0)
       return(*status);
         
    /* read the WCS keyword values from the temporary image */
    ffgics(tptr, xrval, yrval, xrpix, yrpix, xinc, yinc, rot, type, status); 

    if (*status > 0)
    {
      ffpmsg
      ("ffgtcs could not find all the celestial coordinate keywords");
      return(*status = NO_WCS_KEY); 
    }

    /* delete the temporary file */
    fits_delete_file(tptr, status);
    
    return(*status);
}